

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint _c;
  int iVar27;
  int iVar28;
  int _c_00;
  int *piVar29;
  size_t sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  undefined4 uVar38;
  ulong uVar39;
  uint *puVar40;
  long lVar41;
  long lVar42;
  short asVar43 [4];
  uint uVar44;
  long lVar45;
  ulong uVar46;
  uint *puVar47;
  ulong uVar48;
  long lVar49;
  int iVar50;
  uint _h;
  long lVar51;
  uint uVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  int i;
  uint uVar57;
  long lVar58;
  ulong uVar59;
  void *pvVar60;
  uint *puVar61;
  void *pvVar62;
  uint *puVar63;
  long lVar64;
  uint uVar65;
  void *pvVar66;
  long lVar67;
  void *pvVar68;
  void *pvVar69;
  uint uVar70;
  ulong uVar71;
  long lVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  void *local_3a8;
  int tiles;
  int nRowBlocks;
  void *local_378;
  long local_370;
  void *local_368;
  int nColBlocks;
  short d1 [4];
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  Mat local_248;
  short d0 [4];
  Mat local_1a8;
  ulong local_158;
  Mat *local_150;
  ulong local_148;
  long local_140;
  short d2 [4];
  short d3 [4];
  int sum3 [16];
  Option opt_b;
  
  _c = bottom_blob->c;
  iVar27 = top_blob->w;
  iVar28 = top_blob->h;
  _c_00 = top_blob->c;
  uVar39 = (ulong)_c_00;
  piVar29 = bottom_blob->refcount;
  local_1a8.data = bottom_blob->data;
  local_1a8.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_1a8.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_1a8.elemsize = bottom_blob->elemsize;
  local_1a8.elempack = bottom_blob->elempack;
  local_1a8.allocator = bottom_blob->allocator;
  uVar37 = bottom_blob->dims;
  uVar38 = bottom_blob->w;
  local_1a8.h = bottom_blob->h;
  local_1a8.d = bottom_blob->d;
  local_1a8.cstep = bottom_blob->cstep;
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + 1;
    UNLOCK();
  }
  uVar65 = (iVar27 - (iVar27 + 1 >> 0x1f)) + 1;
  uVar44 = uVar65 & 0xfffffffe;
  local_148 = (ulong)uVar44;
  uVar70 = (iVar28 - (iVar28 + 1 >> 0x1f)) + 1;
  _h = uVar70 & 0xfffffffe;
  iVar50 = uVar44 + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_shader_local_memory = opt->use_shader_local_memory;
  opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_1a8.dims = uVar37;
  local_1a8.w = uVar38;
  local_1a8.c = _c;
  local_150 = top_blob;
  copy_make_border(bottom_blob,&local_1a8,0,(_h - bottom_blob->h) + 2,0,iVar50 - bottom_blob->w,0,
                   0.0,&opt_b);
  uVar65 = (int)uVar65 >> 1;
  uVar70 = (int)uVar70 >> 1;
  local_248.cstep = 0;
  uVar44 = uVar70 * uVar65;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  Mat::create(&local_248,0x10,uVar44,_c,2,opt->workspace_allocator);
  auVar2 = _DAT_005516e0;
  auVar73 = _DAT_005516d0;
  uVar46 = (ulong)_c;
  if (0 < (int)_c) {
    lVar51 = (long)iVar50;
    uVar52 = 1;
    if (1 < (int)uVar65) {
      uVar52 = uVar65;
    }
    uVar56 = 1;
    if (1 < (int)uVar70) {
      uVar56 = (ulong)uVar70;
    }
    uVar59 = 0;
    do {
      if (0 < iVar28) {
        pvVar66 = (void *)(local_248.cstep * local_248.elemsize * uVar59 + (long)local_248.data);
        uVar71 = 0;
        do {
          if (0 < iVar27) {
            puVar47 = (uint *)((long)local_1a8.data +
                              (long)(iVar50 * 2 * (int)uVar71) +
                              local_1a8.cstep * local_1a8.elemsize * uVar59);
            puVar61 = (uint *)((long)puVar47 + lVar51);
            puVar63 = (uint *)((long)puVar61 + lVar51);
            puVar40 = (uint *)(lVar51 + (long)puVar63);
            uVar57 = 0;
            do {
              auVar75 = vpmovsxbw_avx(ZEXT416(*puVar47));
              auVar74 = vpmovsxbw_avx(ZEXT416(*puVar61));
              auVar31 = vpmovsxbw_avx(ZEXT416(*puVar63));
              auVar32 = vpmovsxbw_avx(ZEXT416(*puVar40));
              auVar34 = vpsubw_avx(auVar75,auVar31);
              auVar75 = vpaddw_avx(auVar74,auVar31);
              auVar35 = vpsubw_avx(auVar31,auVar74);
              auVar36 = vpsubw_avx(auVar32,auVar74);
              auVar74 = vpsrld_avx(auVar34,0x10);
              auVar31 = vpshufd_avx(auVar34,0x55);
              auVar76 = vpsrlq_avx(auVar34,0x30);
              auVar34 = vpunpcklwd_avx(auVar34,auVar75);
              auVar74 = vpblendw_avx(auVar74,auVar75,2);
              auVar32 = vpshufd_avx(auVar75,0x55);
              auVar31 = vpunpcklwd_avx(auVar31,auVar32);
              auVar75 = vpsrlq_avx(auVar75,0x30);
              auVar32 = vpunpcklwd_avx(auVar76,auVar75);
              auVar34 = vpunpckldq_avx(auVar34,auVar35);
              auVar75 = vpsrld_avx(auVar35,0x10);
              auVar76 = vpunpckldq_avx(auVar74,auVar75);
              auVar75 = vpblendw_avx(auVar31,auVar35,0xc);
              auVar74 = vpsrlq_avx(auVar35,0x30);
              auVar35 = vpunpckldq_avx(auVar32,auVar74);
              auVar74 = vpunpcklwd_avx(auVar34,auVar36);
              auVar31 = vpshufb_avx(auVar74,auVar73);
              auVar74 = vpunpcklwd_avx(auVar76,auVar36);
              auVar32 = vpshufb_avx(auVar74,auVar2);
              auVar75 = vpunpcklwd_avx(auVar75,auVar36);
              auVar75 = vpshuflw_avx(auVar75,0xe8);
              auVar34 = vpshufd_avx(auVar75,0xe8);
              auVar74 = vpblendw_avx(auVar35,auVar36,8);
              auVar75 = vpsubw_avx(auVar31,auVar34);
              asVar43 = auVar75._0_8_;
              d0[0] = asVar43[0];
              d0[1] = asVar43[1];
              d0[2] = asVar43[2];
              d0[3] = asVar43[3];
              auVar75 = vpaddw_avx(auVar32,auVar34);
              asVar43 = auVar75._0_8_;
              d1[0] = asVar43[0];
              d1[1] = asVar43[1];
              d1[2] = asVar43[2];
              d1[3] = asVar43[3];
              auVar75 = vpsubw_avx(auVar34,auVar32);
              asVar43 = auVar75._0_8_;
              d2[0] = asVar43[0];
              d2[1] = asVar43[1];
              d2[2] = asVar43[2];
              d2[3] = asVar43[3];
              auVar75 = vpsubw_avx(auVar74,auVar32);
              asVar43 = auVar75._0_8_;
              d3[0] = asVar43[0];
              d3[1] = asVar43[1];
              d3[2] = asVar43[2];
              d3[3] = asVar43[3];
              lVar41 = 0;
              do {
                *(undefined2 *)((long)pvVar66 + lVar41) = *(undefined2 *)((long)d0 + lVar41);
                *(undefined2 *)((long)pvVar66 + lVar41 + 8) = *(undefined2 *)((long)d1 + lVar41);
                *(undefined2 *)((long)pvVar66 + lVar41 + 0x10) = *(undefined2 *)((long)d2 + lVar41);
                *(undefined2 *)((long)pvVar66 + lVar41 + 0x18) = *(undefined2 *)((long)d3 + lVar41);
                lVar41 = lVar41 + 2;
              } while (lVar41 != 8);
              puVar47 = (uint *)((long)puVar47 + 2);
              puVar61 = (uint *)((long)puVar61 + 2);
              puVar63 = (uint *)((long)puVar63 + 2);
              puVar40 = (uint *)((long)puVar40 + 2);
              pvVar66 = (void *)((long)pvVar66 + 0x20);
              uVar57 = uVar57 + 1;
            } while (uVar57 != uVar52);
          }
          uVar71 = uVar71 + 1;
        } while (uVar71 != uVar56);
      }
      uVar59 = uVar59 + 1;
    } while (uVar59 != uVar46);
  }
  piVar29 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = 0;
  local_1a8.elempack = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  Mat::create((Mat *)d0,0x10,uVar44,_c_00,4,opt->workspace_allocator);
  uVar56 = uVar39 & 0xfffffffffffffffc;
  local_158 = (ulong)uVar44;
  if (0 < _c_00 >> 2) {
    local_378 = kernel_tm->data;
    sVar30 = kernel_tm->elemsize;
    lVar41 = kernel_tm->cstep * sVar30;
    lVar51 = lVar41 * 4;
    local_140 = sVar30 * 4;
    local_2d0 = (void *)((long)local_378 + lVar41);
    local_2d8 = (void *)((long)local_378 + lVar41 * 2);
    local_2e0 = (void *)(lVar41 * 3 + (long)local_378);
    uVar59 = 0;
    do {
      if (0 < (int)uVar44) {
        iVar50 = kernel_tm->w;
        lVar53 = local_248.cstep * local_248.elemsize;
        lVar1 = lVar53 * 4;
        lVar45 = (long)iVar50 * sVar30;
        local_368 = (void *)0x0;
        local_370 = 0;
        uVar71 = 0;
        do {
          uVar55 = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          d2[0] = 0;
          d2[1] = 0;
          d2[2] = 0;
          d2[3] = 0;
          d3[0] = 0;
          d3[1] = 0;
          d3[2] = 0;
          d3[3] = 0;
          sum3[8] = 0;
          sum3[9] = 0;
          sum3[10] = 0;
          sum3[0xb] = 0;
          sum3[0xc] = 0;
          sum3[0xd] = 0;
          sum3[0xe] = 0;
          sum3[0xf] = 0;
          sum3[0] = 0;
          sum3[1] = 0;
          sum3[2] = 0;
          sum3[3] = 0;
          sum3[4] = 0;
          sum3[5] = 0;
          sum3[6] = 0;
          sum3[7] = 0;
          if (3 < (int)_c) {
            lVar64 = local_248.w * local_370;
            pvVar66 = (void *)((long)local_248.data + lVar64);
            lVar54 = (long)local_248.data + lVar64 + lVar53;
            lVar58 = (long)local_248.data + lVar64 + lVar53 * 2;
            lVar64 = (long)local_248.data + lVar64 + lVar53 * 3;
            uVar48 = 0;
            pvVar60 = local_378;
            do {
              lVar67 = 0;
              do {
                auVar73._8_8_ = 0;
                auVar73._0_8_ = *(ulong *)((long)pvVar66 + lVar67);
                auVar33 = vpmovsxwd_avx(auVar73);
                auVar2._8_8_ = 0;
                auVar2._0_8_ = *(ulong *)((long)pvVar60 + lVar67);
                auVar73 = vpmovzxwd_avx(auVar2);
                auVar73 = vpmaddwd_avx(auVar73,auVar33);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d1 + lVar67));
                *(undefined1 (*) [16])(d1 + lVar67) = auVar73;
                auVar75._8_8_ = 0;
                auVar75._0_8_ = *(ulong *)(lVar54 + lVar67);
                auVar75 = vpmovsxwd_avx(auVar75);
                auVar74._8_8_ = 0;
                auVar74._0_8_ = *(ulong *)((long)pvVar60 + lVar67 + 0x20);
                auVar2 = vpmovzxwd_avx(auVar74);
                auVar2 = vpmaddwd_avx(auVar2,auVar75);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d1 + lVar67) = auVar73;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = *(ulong *)(lVar58 + lVar67);
                auVar74 = vpmovsxwd_avx(auVar31);
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *(ulong *)((long)pvVar60 + lVar67 + 0x40);
                auVar2 = vpmovzxwd_avx(auVar32);
                auVar2 = vpmaddwd_avx(auVar2,auVar74);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d1 + lVar67) = auVar73;
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *(ulong *)(lVar64 + lVar67);
                auVar31 = vpmovsxwd_avx(auVar34);
                auVar35._8_8_ = 0;
                auVar35._0_8_ = *(ulong *)((long)pvVar60 + lVar67 + 0x60);
                auVar2 = vpmovzxwd_avx(auVar35);
                auVar2 = vpmaddwd_avx(auVar2,auVar31);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d1 + lVar67) = auVar73;
                auVar36._8_8_ = 0;
                auVar36._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + lVar67);
                auVar73 = vpmovzxwd_avx(auVar36);
                auVar73 = vpmaddwd_avx(auVar73,auVar33);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d2 + lVar67));
                *(undefined1 (*) [16])(d2 + lVar67) = auVar73;
                auVar76._8_8_ = 0;
                auVar76._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x20 + lVar67);
                auVar2 = vpmovzxwd_avx(auVar76);
                lVar72 = lVar41 + lVar67;
                auVar2 = vpmaddwd_avx(auVar2,auVar75);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d2 + lVar67) = auVar73;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x40 + lVar67);
                auVar2 = vpmovzxwd_avx(auVar3);
                auVar2 = vpmaddwd_avx(auVar2,auVar74);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d2 + lVar67) = auVar73;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x60 + lVar67);
                auVar2 = vpmovzxwd_avx(auVar4);
                auVar2 = vpmaddwd_avx(auVar2,auVar31);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d2 + lVar67) = auVar73;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + lVar72);
                auVar73 = vpmovzxwd_avx(auVar5);
                auVar73 = vpmaddwd_avx(auVar73,auVar33);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d3 + lVar67));
                *(undefined1 (*) [16])(d3 + lVar67) = auVar73;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x20 + lVar72);
                auVar2 = vpmovzxwd_avx(auVar6);
                lVar49 = lVar41 + lVar72;
                auVar2 = vpmaddwd_avx(auVar2,auVar75);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d3 + lVar67) = auVar73;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x40 + lVar72);
                auVar2 = vpmovzxwd_avx(auVar7);
                auVar2 = vpmaddwd_avx(auVar2,auVar74);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d3 + lVar67) = auVar73;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x60 + lVar72);
                auVar2 = vpmovzxwd_avx(auVar8);
                auVar2 = vpmaddwd_avx(auVar2,auVar31);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d3 + lVar67) = auVar73;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + lVar49);
                auVar73 = vpmovzxwd_avx(auVar9);
                auVar73 = vpmaddwd_avx(auVar73,auVar33);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])((long)sum3 + lVar67 * 2));
                *(undefined1 (*) [16])((long)sum3 + lVar67 * 2) = auVar73;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x20 + lVar49);
                auVar2 = vpmovzxwd_avx(auVar33);
                auVar2 = vpmaddwd_avx(auVar2,auVar75);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])((long)sum3 + lVar67 * 2) = auVar73;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x40 + lVar49);
                auVar2 = vpmovzxwd_avx(auVar10);
                auVar2 = vpmaddwd_avx(auVar2,auVar74);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])((long)sum3 + lVar67 * 2) = auVar73;
                auVar11._8_8_ = 0;
                auVar11._0_8_ = *(ulong *)((long)pvVar60 + lVar41 + 0x60 + lVar49);
                auVar2 = vpmovzxwd_avx(auVar11);
                auVar2 = vpmaddwd_avx(auVar2,auVar31);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])((long)sum3 + lVar67 * 2) = auVar73;
                lVar67 = lVar67 + 8;
              } while (lVar67 != 0x20);
              uVar55 = uVar48 + 4;
              lVar67 = uVar48 + 7;
              pvVar66 = (void *)((long)pvVar66 + lVar1);
              pvVar60 = (void *)((long)pvVar60 + local_140 * iVar50);
              lVar54 = lVar54 + lVar1;
              lVar58 = lVar58 + lVar1;
              lVar64 = lVar64 + lVar1;
              uVar48 = uVar55;
            } while (lVar67 < (int)_c);
          }
          if ((int)uVar55 < (int)_c) {
            uVar55 = uVar55 & 0xffffffff;
            lVar54 = (long)local_248.data + (long)local_248.w * (long)local_368 + lVar53 * uVar55;
            lVar58 = lVar45 * uVar55;
            pvVar66 = (void *)((long)local_378 + lVar58);
            pvVar68 = (void *)((long)local_2d0 + lVar58);
            pvVar62 = (void *)((long)local_2d8 + lVar58);
            pvVar60 = (void *)(lVar58 + (long)local_2e0);
            do {
              lVar58 = 0;
              do {
                auVar12._8_8_ = 0;
                auVar12._0_8_ = *(ulong *)(lVar54 + lVar58);
                auVar2 = vpmovsxwd_avx(auVar12);
                auVar13._8_8_ = 0;
                auVar13._0_8_ = *(ulong *)((long)pvVar66 + lVar58);
                auVar73 = vpmovzxwd_avx(auVar13);
                auVar73 = vpmaddwd_avx(auVar73,auVar2);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d1 + lVar58));
                *(undefined1 (*) [16])(d1 + lVar58) = auVar73;
                auVar14._8_8_ = 0;
                auVar14._0_8_ = *(ulong *)((long)pvVar68 + lVar58);
                auVar73 = vpmovzxwd_avx(auVar14);
                auVar73 = vpmaddwd_avx(auVar73,auVar2);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d2 + lVar58));
                *(undefined1 (*) [16])(d2 + lVar58) = auVar73;
                auVar15._8_8_ = 0;
                auVar15._0_8_ = *(ulong *)((long)pvVar62 + lVar58);
                auVar73 = vpmovzxwd_avx(auVar15);
                auVar73 = vpmaddwd_avx(auVar73,auVar2);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d3 + lVar58));
                *(undefined1 (*) [16])(d3 + lVar58) = auVar73;
                auVar16._8_8_ = 0;
                auVar16._0_8_ = *(ulong *)((long)pvVar60 + lVar58);
                auVar73 = vpmovzxwd_avx(auVar16);
                auVar73 = vpmaddwd_avx(auVar73,auVar2);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])((long)sum3 + lVar58 * 2));
                *(undefined1 (*) [16])((long)sum3 + lVar58 * 2) = auVar73;
                lVar58 = lVar58 + 8;
              } while (lVar58 != 0x20);
              uVar55 = uVar55 + 1;
              lVar54 = lVar54 + lVar53;
              pvVar66 = (void *)((long)pvVar66 + lVar45);
              pvVar68 = (void *)((long)pvVar68 + lVar45);
              pvVar62 = (void *)((long)pvVar62 + lVar45);
              pvVar60 = (void *)((long)pvVar60 + lVar45);
            } while (uVar55 != uVar46);
          }
          lVar54 = 0;
          do {
            *(undefined4 *)((long)d0 + lVar54) = *(undefined4 *)((long)d1 + lVar54);
            *(undefined4 *)((long)d0 + lVar54) = *(undefined4 *)((long)d2 + lVar54);
            *(undefined4 *)((long)d0 + lVar54) = *(undefined4 *)((long)d3 + lVar54);
            *(undefined4 *)((long)d0 + lVar54) = *(undefined4 *)((long)sum3 + lVar54);
            lVar54 = lVar54 + 4;
          } while (lVar54 != 0x40);
          uVar71 = uVar71 + 1;
          local_370 = local_370 + local_248.elemsize;
          local_368 = (void *)((long)local_368 + local_248.elemsize);
        } while (uVar71 != local_158);
      }
      uVar59 = uVar59 + 1;
      local_378 = (void *)((long)local_378 + lVar51);
      local_2d0 = (void *)((long)local_2d0 + lVar51);
      local_2d8 = (void *)((long)local_2d8 + lVar51);
      local_2e0 = (void *)((long)local_2e0 + lVar51);
    } while (uVar59 != (uint)(_c_00 >> 2));
  }
  if ((int)uVar56 != _c_00) {
    local_368 = kernel_tm->data;
    sVar30 = kernel_tm->elemsize;
    lVar41 = kernel_tm->cstep * sVar30;
    local_3a8 = (void *)(lVar41 * uVar56 + (long)local_368);
    lVar51 = kernel_tm->cstep * uVar56;
    do {
      if (0 < (int)uVar44) {
        lVar45 = (long)kernel_tm->w;
        lVar54 = local_248.cstep * local_248.elemsize;
        lVar1 = lVar54 * 4;
        lVar53 = sVar30 * 4 * lVar45;
        lVar58 = 0;
        lVar64 = 0;
        uVar59 = 0;
        do {
          uVar71 = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          if (3 < (int)_c) {
            lVar49 = local_248.w * lVar64;
            pvVar66 = (void *)((long)local_248.data + lVar49);
            lVar67 = (long)local_248.data + lVar49 + lVar54;
            lVar72 = (long)local_248.data + lVar49 + lVar54 * 2;
            lVar49 = (long)local_248.data + lVar49 + lVar54 * 3;
            pvVar60 = (void *)((long)local_3a8 + sVar30 * lVar45);
            uVar55 = 0;
            pvVar62 = (void *)(sVar30 * 2 * lVar45 + (long)local_3a8);
            pvVar68 = (void *)(sVar30 * 3 * lVar45 + (long)local_3a8);
            pvVar69 = local_3a8;
            do {
              lVar42 = 0;
              do {
                auVar17._8_8_ = 0;
                auVar17._0_8_ = *(ulong *)((long)pvVar66 + lVar42);
                auVar73 = vpmovzxwd_avx(auVar17);
                auVar18._8_8_ = 0;
                auVar18._0_8_ = *(ulong *)((long)pvVar69 + lVar42);
                auVar2 = vpmovzxwd_avx(auVar18);
                auVar73 = vpmaddwd_avx(auVar2,auVar73);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d1 + lVar42));
                *(undefined1 (*) [16])(d1 + lVar42) = auVar73;
                auVar19._8_8_ = 0;
                auVar19._0_8_ = *(ulong *)(lVar67 + lVar42);
                auVar2 = vpmovzxwd_avx(auVar19);
                auVar20._8_8_ = 0;
                auVar20._0_8_ = *(ulong *)((long)pvVar60 + lVar42);
                auVar75 = vpmovzxwd_avx(auVar20);
                auVar2 = vpmaddwd_avx(auVar75,auVar2);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d1 + lVar42) = auVar73;
                auVar21._8_8_ = 0;
                auVar21._0_8_ = *(ulong *)(lVar72 + lVar42);
                auVar2 = vpmovzxwd_avx(auVar21);
                auVar22._8_8_ = 0;
                auVar22._0_8_ = *(ulong *)((long)pvVar62 + lVar42);
                auVar75 = vpmovzxwd_avx(auVar22);
                auVar2 = vpmaddwd_avx(auVar75,auVar2);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d1 + lVar42) = auVar73;
                auVar23._8_8_ = 0;
                auVar23._0_8_ = *(ulong *)(lVar49 + lVar42);
                auVar2 = vpmovzxwd_avx(auVar23);
                auVar24._8_8_ = 0;
                auVar24._0_8_ = *(ulong *)((long)pvVar68 + lVar42);
                auVar75 = vpmovzxwd_avx(auVar24);
                auVar2 = vpmaddwd_avx(auVar75,auVar2);
                auVar73 = vpaddd_avx(auVar2,auVar73);
                *(undefined1 (*) [16])(d1 + lVar42) = auVar73;
                lVar42 = lVar42 + 8;
              } while (lVar42 != 0x20);
              uVar71 = uVar55 + 4;
              lVar42 = uVar55 + 7;
              pvVar66 = (void *)((long)pvVar66 + lVar1);
              pvVar69 = (void *)((long)pvVar69 + lVar53);
              lVar67 = lVar67 + lVar1;
              pvVar60 = (void *)((long)pvVar60 + lVar53);
              lVar72 = lVar72 + lVar1;
              pvVar62 = (void *)((long)pvVar62 + lVar53);
              lVar49 = lVar49 + lVar1;
              pvVar68 = (void *)((long)pvVar68 + lVar53);
              uVar55 = uVar71;
            } while (lVar42 < (int)_c);
          }
          if ((int)uVar71 < (int)_c) {
            uVar71 = uVar71 & 0xffffffff;
            lVar67 = (long)local_248.data + local_248.w * lVar58 + lVar54 * uVar71;
            pvVar66 = (void *)((lVar45 * uVar71 + lVar51) * sVar30 + (long)local_368);
            do {
              lVar72 = 0;
              do {
                auVar25._8_8_ = 0;
                auVar25._0_8_ = *(ulong *)(lVar67 + lVar72 * 2);
                auVar73 = vpmovzxwd_avx(auVar25);
                auVar26._8_8_ = 0;
                auVar26._0_8_ = *(ulong *)((long)pvVar66 + lVar72 * 2);
                auVar2 = vpmovzxwd_avx(auVar26);
                auVar73 = vpmaddwd_avx(auVar2,auVar73);
                auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])(d1 + lVar72 * 2));
                *(undefined1 (*) [16])(d1 + lVar72 * 2) = auVar73;
                lVar72 = lVar72 + 4;
              } while (lVar72 != 0x10);
              uVar71 = uVar71 + 1;
              lVar67 = lVar67 + lVar54;
              pvVar66 = (void *)((long)pvVar66 + sVar30 * lVar45);
            } while (uVar71 != uVar46);
          }
          *(undefined8 *)((long)d0 + 0x20) = 0;
          *(undefined8 *)((long)d0 + 0x28) = 0;
          *(undefined8 *)((long)d0 + 0x30) = 0;
          *(undefined8 *)((long)d0 + 0x38) = 0;
          *(short (*) [4])d0 = d1;
          *(undefined8 *)((long)d0 + 8) = 0;
          *(undefined8 *)((long)d0 + 0x10) = 0;
          *(undefined8 *)((long)d0 + 0x18) = 0;
          uVar59 = uVar59 + 1;
          lVar64 = lVar64 + local_248.elemsize;
          lVar58 = lVar58 + local_248.elemsize;
        } while (uVar59 != local_158);
      }
      uVar56 = uVar56 + 1;
      local_3a8 = (void *)((long)local_3a8 + lVar41);
      local_368 = (void *)((long)local_368 + lVar41);
    } while ((long)uVar56 < (long)uVar39);
  }
  piVar29 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  Mat::create((Mat *)d1,(int)local_148,_h,_c_00,4,opt->workspace_allocator);
  if (0 < _c_00) {
    uVar46 = 1;
    if (1 < (int)uVar65) {
      uVar46 = (ulong)uVar65;
    }
    uVar56 = 1;
    if (1 < (int)uVar70) {
      uVar56 = (ulong)uVar70;
    }
    uVar59 = 0;
    do {
      if (0 < iVar28) {
        uVar71 = 0;
        do {
          asVar43 = d1;
          uVar55 = uVar46;
          if (0 < iVar27) {
            do {
              auVar73 = vpaddd_avx(*(undefined1 (*) [16])((long)d0 + 0x10),*(undefined1 (*) [16])d0)
              ;
              auVar73 = vpaddd_avx(auVar73,*(undefined1 (*) [16])((long)d0 + 0x20));
              auVar2 = vpsubd_avx(*(undefined1 (*) [16])((long)d0 + 0x10),
                                  *(undefined1 (*) [16])((long)d0 + 0x20));
              auVar2 = vpaddd_avx(auVar2,*(undefined1 (*) [16])((long)d0 + 0x30));
              auVar75 = vpshufd_avx(auVar73,0x55);
              auVar75 = vpblendw_avx(auVar75,auVar2,0xc);
              auVar32 = vpunpckhdq_avx(auVar73,auVar2);
              auVar74 = vpshufd_avx(auVar2,0xee);
              auVar31 = vpshufd_avx(auVar73,0xff);
              auVar73 = vphaddd_avx(auVar73,auVar2);
              auVar2 = vpblendw_avx(auVar31,auVar74,0xc);
              auVar73 = vpshufd_avx(auVar73,0xe8);
              auVar73 = vpaddd_avx(auVar73,auVar32);
              auVar75 = vpsubd_avx(auVar75,auVar32);
              auVar2 = vpaddd_avx(auVar75,auVar2);
              auVar73 = vpsrad_avx(auVar73,2);
              *(long *)asVar43 = auVar73._0_8_;
              auVar73 = vpsrad_avx(auVar2,2);
              *(long *)asVar43 = auVar73._0_8_;
              uVar55 = uVar55 - 1;
              asVar43 = (short  [4])((long)asVar43 + 8);
            } while (uVar55 != 0);
          }
          uVar71 = uVar71 + 1;
        } while (uVar71 != uVar56);
      }
      uVar59 = uVar59 + 1;
    } while (uVar59 != uVar39);
  }
  copy_cut_border((Mat *)d1,local_150,0,-local_150->h,0,-local_150->w,opt);
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  piVar29 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  piVar29 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4], d1[4], d2[4], d3[4];
                    short w0[4], w1[4], w2[4], w3[4];
                    short t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q + 1);
                    const short* k2 = kernel0_tm.row<short>(q + 2);
                    const short* k3 = kernel0_tm.row<short>(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j = 0; j < nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j * 2);
                int* outRow1 = out.row<int>(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j * nRowBlocks + i);

                    int s0[4], s1[4], s2[4], s3[4];
                    int w0[4], w1[4];
                    int d0[2], d1[2], d2[2], d3[2];
                    int o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}